

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order.cpp
# Opt level: O0

void __thiscall Lui::Lui(Lui *this,uchar *data)

{
  uchar *data_local;
  Lui *this_local;
  
  order::order(&this->super_order,data);
  (this->super_order)._vptr_order = (_func_int **)&PTR_ID_exe_00109b28;
  (this->super_order).op = lui;
  this->imm = 0;
  this->rd_id = 0;
  (this->super_order).EX_need = true;
  (this->super_order).MEM_need = false;
  (this->super_order).WB_need = true;
  return;
}

Assistant:

Lui::Lui(unsigned char *data) : order(data) {
    op=lui;
    imm=0;
    rd_id=0;
    EX_need=true;
    MEM_need=false;
    WB_need=true;
}